

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.cpp
# Opt level: O2

void deqp::gls::StateQueryUtil::queryState
               (ResultCollector *result,CallLogWrapper *gl,QueryType type,GLenum target,
               QueriedState *state)

{
  GLboolean v;
  bool bVar1;
  StateQueryMemoryWriteGuard<unsigned_char> value;
  undefined1 local_38 [4];
  float local_34;
  GLint64 local_30 [2];
  
  switch(type) {
  case QUERY_BOOLEAN:
    local_38[0] = 0xde;
    local_38[1] = 0xde;
    local_38[2] = 0xde;
    glu::CallLogWrapper::glGetBooleanv(gl,target,local_38 + 1);
    bVar1 = checkError(result,gl,"glGetBooleanv");
    if (!bVar1) {
      return;
    }
    bVar1 = StateQueryMemoryWriteGuard<unsigned_char>::verifyValidity
                      ((StateQueryMemoryWriteGuard<unsigned_char> *)local_38,result);
    if (!bVar1) {
      return;
    }
    bVar1 = verifyBooleanValidity(result,local_38[1]);
    if (!bVar1) {
      return;
    }
    state->m_type = DATATYPE_BOOLEAN;
    goto LAB_008324e5;
  case QUERY_ISENABLED:
    v = glu::CallLogWrapper::glIsEnabled(gl,target);
    bVar1 = checkError(result,gl,"glIsEnabled");
    if (!bVar1) {
      return;
    }
    bVar1 = verifyBooleanValidity(result,v);
    if (!bVar1) {
      return;
    }
    state->m_type = DATATYPE_BOOLEAN;
    local_38[1] = v;
LAB_008324e5:
    (state->m_v).vBool = local_38[1] == '\x01';
    break;
  case QUERY_INTEGER:
    StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
              ((StateQueryMemoryWriteGuard<int> *)local_38);
    glu::CallLogWrapper::glGetIntegerv(gl,target,(GLint *)&local_34);
    bVar1 = checkError(result,gl,"glGetIntegerv");
    if ((bVar1) &&
       (bVar1 = StateQueryMemoryWriteGuard<int>::verifyValidity
                          ((StateQueryMemoryWriteGuard<int> *)local_38,result), bVar1)) {
      state->m_type = DATATYPE_INTEGER;
      (state->m_v).vInt = (GLint)local_34;
    }
    break;
  case QUERY_INTEGER64:
    StateQueryMemoryWriteGuard<long>::StateQueryMemoryWriteGuard
              ((StateQueryMemoryWriteGuard<long> *)local_38);
    glu::CallLogWrapper::glGetInteger64v(gl,target,local_30);
    bVar1 = checkError(result,gl,"glGetInteger64v");
    if ((bVar1) &&
       (bVar1 = StateQueryMemoryWriteGuard<long>::verifyValidity
                          ((StateQueryMemoryWriteGuard<long> *)local_38,result), bVar1)) {
      state->m_type = DATATYPE_INTEGER64;
      (state->m_v).vInt64 = local_30[0];
    }
    break;
  case QUERY_FLOAT:
    StateQueryMemoryWriteGuard<float>::StateQueryMemoryWriteGuard
              ((StateQueryMemoryWriteGuard<float> *)local_38);
    glu::CallLogWrapper::glGetFloatv(gl,target,&local_34);
    bVar1 = checkError(result,gl,"glGetFloatv");
    if ((bVar1) &&
       (bVar1 = StateQueryMemoryWriteGuard<float>::verifyValidity
                          ((StateQueryMemoryWriteGuard<float> *)local_38,result), bVar1)) {
      state->m_type = DATATYPE_FLOAT;
      (state->m_v).vInt = (GLint)local_34;
    }
  }
  return;
}

Assistant:

void queryState (tcu::ResultCollector& result, glu::CallLogWrapper& gl, QueryType type, glw::GLenum target, QueriedState& state)
{
	switch (type)
	{
		case QUERY_ISENABLED:
		{
			const glw::GLboolean value = gl.glIsEnabled(target);

			if (!checkError(result, gl, "glIsEnabled"))
				return;

			if (!verifyBooleanValidity(result, value))
				return;

			state = QueriedState(value == GL_TRUE);
			break;
		}

		case QUERY_BOOLEAN:
		{
			StateQueryMemoryWriteGuard<glw::GLboolean> value;
			gl.glGetBooleanv(target, &value);

			if (!checkError(result, gl, "glGetBooleanv"))
				return;

			if (!value.verifyValidity(result))
				return;
			if (!verifyBooleanValidity(result, value))
				return;

			state = QueriedState(value == GL_TRUE);
			break;
		}

		case QUERY_INTEGER:
		{
			StateQueryMemoryWriteGuard<glw::GLint> value;
			gl.glGetIntegerv(target, &value);

			if (!checkError(result, gl, "glGetIntegerv"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}

		case QUERY_INTEGER64:
		{
			StateQueryMemoryWriteGuard<glw::GLint64> value;
			gl.glGetInteger64v(target, &value);

			if (!checkError(result, gl, "glGetInteger64v"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}

		case QUERY_FLOAT:
		{
			StateQueryMemoryWriteGuard<glw::GLfloat> value;
			gl.glGetFloatv(target, &value);

			if (!checkError(result, gl, "glGetFloatv"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}

		default:
			DE_ASSERT(DE_FALSE);
			break;
	}
}